

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkylineBinPack.cpp
# Opt level: O2

bool __thiscall
SkylineBinPack::RectangleFits(SkylineBinPack *this,int skylineNodeIndex,int width,int height,int *y)

{
  long lVar1;
  SkylineNode *pSVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  int *piVar6;
  
  lVar4 = (long)skylineNodeIndex;
  pSVar2 = (this->skyLine).Array;
  if (this->binWidth < pSVar2[lVar4].x + width) {
    bVar3 = false;
  }
  else {
    iVar5 = pSVar2[lVar4].y;
    *y = iVar5;
    piVar6 = &pSVar2[lVar4].width;
    lVar4 = lVar4 + 1;
    while (bVar3 = width < 1, 0 < width) {
      if (iVar5 <= piVar6[-1]) {
        iVar5 = piVar6[-1];
      }
      *y = iVar5;
      if (this->binHeight < iVar5 + height) {
        return bVar3;
      }
      width = width - *piVar6;
      piVar6 = piVar6 + 3;
      lVar1 = lVar4 + 1;
      bVar3 = (int)(this->skyLine).Count <= lVar4;
      lVar4 = lVar1;
      if ((bVar3) && (0 < width)) {
        __assert_fail("i < (int)skyLine.Size() || widthLeft <= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/SkylineBinPack.cpp"
                      ,0x91,"bool SkylineBinPack::RectangleFits(int, int, int, int &) const");
      }
    }
  }
  return bVar3;
}

Assistant:

bool SkylineBinPack::RectangleFits(int skylineNodeIndex, int width, int height, int &y) const
{
	int x = skyLine[skylineNodeIndex].x;
	if (x + width > binWidth)
		return false;
	int widthLeft = width;
	int i = skylineNodeIndex;
	y = skyLine[skylineNodeIndex].y;
	while(widthLeft > 0)
	{
		y = MAX(y, skyLine[i].y);
		if (y + height > binHeight)
			return false;
		widthLeft -= skyLine[i].width;
		++i;
		assert(i < (int)skyLine.Size() || widthLeft <= 0);
	}
	return true;
}